

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O0

ReaderTablesPtr Omega_h::yaml::ask_reader_tables(void)

{
  int iVar1;
  long lVar2;
  element_type *language;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ReaderTablesPtr RVar3;
  shared_ptr<Omega_h::Language> local_30;
  shared_ptr<const_Omega_h::ReaderTables> local_20;
  
  if (ask_reader_tables()::ptr == '\0') {
    iVar1 = __cxa_guard_acquire(&ask_reader_tables()::ptr);
    if (iVar1 != 0) {
      __cxa_atexit(std::shared_ptr<const_Omega_h::ReaderTables>::~shared_ptr,&ask_reader_tables::ptr
                   ,&__dso_handle);
      __cxa_guard_release(&ask_reader_tables()::ptr);
    }
  }
  lVar2 = std::__shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>::use_count
                    (&ask_reader_tables::ptr.
                      super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>);
  if (lVar2 == 0) {
    ask_language();
    language = std::__shared_ptr_access<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_30);
    build_reader_tables((Omega_h *)&local_20,language);
    std::shared_ptr<const_Omega_h::ReaderTables>::operator=(&ask_reader_tables::ptr,&local_20);
    std::shared_ptr<const_Omega_h::ReaderTables>::~shared_ptr(&local_20);
    std::shared_ptr<Omega_h::Language>::~shared_ptr(&local_30);
  }
  std::shared_ptr<const_Omega_h::ReaderTables>::shared_ptr
            ((shared_ptr<const_Omega_h::ReaderTables> *)in_RDI,&ask_reader_tables::ptr);
  RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ReaderTablesPtr)
         RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReaderTablesPtr ask_reader_tables() {
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wexit-time-destructors"
#endif
  static ReaderTablesPtr ptr;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  if (ptr.use_count() == 0) {
    ptr = build_reader_tables(*(yaml::ask_language()));
  }
  return ptr;
}